

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

void __thiscall VRle::Data::translate(Data *this,VPoint *p)

{
  bool bVar1;
  int dx;
  int dy;
  reference pSVar2;
  VRect *this_00;
  long in_RDI;
  Data *unaff_retaddr;
  Span *i;
  iterator __end1;
  iterator __begin1;
  vector<VRle::Span,_std::allocator<VRle::Span>_> *__range1;
  int y;
  int x;
  VPoint *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  __normal_iterator<VRle::Span_*,_std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>
  local_30 [2];
  int local_20;
  int local_1c;
  VPoint local_18;
  
  local_18 = ::operator-(in_stack_ffffffffffffffa8,(VPoint *)0x121656);
  *(VPoint *)(in_RDI + 0x18) = local_18;
  local_1c = VPoint::x((VPoint *)(in_RDI + 0x18));
  local_20 = VPoint::y((VPoint *)(in_RDI + 0x18));
  local_30[0]._M_current =
       (Span *)std::vector<VRle::Span,_std::allocator<VRle::Span>_>::begin
                         ((vector<VRle::Span,_std::allocator<VRle::Span>_> *)
                          in_stack_ffffffffffffffa8);
  std::vector<VRle::Span,_std::allocator<VRle::Span>_>::end
            ((vector<VRle::Span,_std::allocator<VRle::Span>_> *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<VRle::Span_*,_std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (__normal_iterator<VRle::Span_*,_std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<VRle::Span_*,_std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>
             ::operator*(local_30);
    pSVar2->x = pSVar2->x + (short)local_1c;
    pSVar2->y = pSVar2->y + (short)local_20;
    __gnu_cxx::
    __normal_iterator<VRle::Span_*,_std::vector<VRle::Span,_std::allocator<VRle::Span>_>_>::
    operator++(local_30);
  }
  updateBbox(unaff_retaddr);
  this_00 = (VRect *)(in_RDI + 0x20);
  dx = VPoint::x((VPoint *)(in_RDI + 0x18));
  dy = VPoint::y((VPoint *)(in_RDI + 0x18));
  VRect::translate(this_00,dx,dy);
  return;
}

Assistant:

void VRle::Data::translate(const VPoint &p)
{
    // take care of last offset if applied
    mOffset = p - mOffset;
    int x = mOffset.x();
    int y = mOffset.y();
    for (auto &i : mSpans) {
        i.x = i.x + x;
        i.y = i.y + y;
    }
    updateBbox();
    mBbox.translate(mOffset.x(), mOffset.y());
}